

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawImageObjectUtil.cpp
# Opt level: O1

void vkt::Draw::MemoryOp::unpack
               (int pixelSize,int width,int height,int depth,VkDeviceSize rowPitchOrZero,
               VkDeviceSize depthPitchOrZero,void *srcBuffer,void *destBuffer)

{
  long lVar1;
  int iVar2;
  void *__src;
  size_t __n;
  void *__dest;
  
  __n = (size_t)(pixelSize * width);
  if (rowPitchOrZero == 0) {
    rowPitchOrZero = __n;
  }
  if (depthPitchOrZero == 0) {
    depthPitchOrZero = (long)height * rowPitchOrZero;
  }
  if ((long)height * rowPitchOrZero == depthPitchOrZero && rowPitchOrZero == __n) {
    memcpy(destBuffer,srcBuffer,depthPitchOrZero * (long)depth);
    return;
  }
  if (depth != 0) {
    lVar1 = 0;
    do {
      if (0 < height) {
        __dest = (void *)(lVar1 * (pixelSize * width * height) + (long)destBuffer);
        __src = (void *)(lVar1 * depthPitchOrZero + (long)srcBuffer);
        iVar2 = height;
        do {
          memcpy(__dest,__src,__n);
          __src = (void *)((long)__src + rowPitchOrZero);
          __dest = (void *)((long)__dest + __n);
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 != depth);
  }
  return;
}

Assistant:

void MemoryOp::unpack (int					pixelSize,
					   int					width,
					   int					height,
					   int					depth,
					   vk::VkDeviceSize		rowPitchOrZero,
					   vk::VkDeviceSize		depthPitchOrZero,
					   const void *			srcBuffer,
					   void *				destBuffer)
{
	vk::VkDeviceSize rowPitch	= rowPitchOrZero;
	vk::VkDeviceSize depthPitch = depthPitchOrZero;

	if (rowPitch == 0)
		rowPitch = width * pixelSize;

	if (depthPitch == 0)
		depthPitch = rowPitch * height;

	const vk::VkDeviceSize size = depthPitch * depth;

	const deUint8 *srcRow = reinterpret_cast<const deUint8 *>(srcBuffer);
	const deUint8 *srcStart;
	srcStart = srcRow;
	deUint8 *dstRow = reinterpret_cast<deUint8 *>(destBuffer);
	deUint8 *dstStart;
	dstStart = dstRow;

	if (rowPitch == static_cast<vk::VkDeviceSize>(width * pixelSize) &&
		depthPitch == static_cast<vk::VkDeviceSize>(rowPitch * height))
	{
		// fast path
		deMemcpy(dstRow, srcRow, static_cast<size_t>(size));
	}
	else {
		// slower, per row path
		for (size_t d = 0; d < (size_t)depth; d++)
		{
			vk::VkDeviceSize offsetDepthDst = d * (pixelSize * width * height);
			vk::VkDeviceSize offsetDepthSrc = d * depthPitch;
			srcRow = srcStart + offsetDepthSrc;
			dstRow = dstStart + offsetDepthDst;
			for (int r = 0; r < height; ++r)
			{
				deMemcpy(dstRow, srcRow, static_cast<size_t>(pixelSize * width));
				srcRow += rowPitch;
				dstRow += pixelSize * width;
			}
		}
	}
}